

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aialgorithm.h
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
ai::
extractKeys<std::map<unsigned_long,unsigned_long,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,ai *this,
          map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          *map)

{
  bool bVar1;
  size_type __n;
  reference __x;
  pair<const_unsigned_long,_unsigned_long> *it;
  const_iterator __end0;
  const_iterator __begin0;
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *__range2;
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *map_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *result;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(__return_storage_ptr__);
  __n = std::
        map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
        ::size((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                *)this);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(__return_storage_ptr__,__n);
  __end0 = std::
           map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           ::begin((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                    *)this);
  it = (pair<const_unsigned_long,_unsigned_long> *)
       std::
       map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
       ::end((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
              *)this);
  while (bVar1 = std::operator!=(&__end0,(_Self *)&it), bVar1) {
    __x = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator*
                    (&__end0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (__return_storage_ptr__,&__x->first);
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator++
              (&__end0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<typename Map::key_type> extractKeys(const Map& map)
    {
        static_assert(std::is_same<typename Map::mapped_type, typename Map::value_type::second_type>::value,
            "map must provide AssociativeContainer requirements. see: https://en.cppreference.com/w/cpp/named_req/AssociativeContainer");

        std::vector<typename Map::key_type> result;
        result.reserve(map.size());
        for(const auto& it : map)
        {
            result.push_back(it.first);
        }
        return result;
    }